

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void switch_mode(CPUARMState_conflict *env,int mode)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = env->uncached_cpsr & 0x1f;
  if (uVar4 == mode) {
    return;
  }
  if (uVar4 == 0x11) {
    env->fiq_regs[4] = env->regs[0xc];
    uVar1 = *(undefined8 *)(env->regs + 10);
    *(undefined8 *)env->fiq_regs = *(undefined8 *)(env->regs + 8);
    *(undefined8 *)(env->fiq_regs + 2) = uVar1;
    uVar1 = *(undefined8 *)(env->usr_regs + 2);
    *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->usr_regs;
    *(undefined8 *)(env->regs + 10) = uVar1;
    uVar2 = env->usr_regs[4];
  }
  else {
    if (mode != 0x11) goto LAB_005a8ad2;
    env->usr_regs[4] = env->regs[0xc];
    uVar1 = *(undefined8 *)(env->regs + 10);
    *(undefined8 *)env->usr_regs = *(undefined8 *)(env->regs + 8);
    *(undefined8 *)(env->usr_regs + 2) = uVar1;
    uVar1 = *(undefined8 *)(env->fiq_regs + 2);
    *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->fiq_regs;
    *(undefined8 *)(env->regs + 10) = uVar1;
    uVar2 = env->fiq_regs[4];
  }
  env->regs[0xc] = uVar2;
LAB_005a8ad2:
  uVar3 = bank_number(uVar4);
  env->banked_r13[uVar3] = env->regs[0xd];
  env->banked_spsr[uVar3] = (ulong)env->spsr;
  uVar3 = bank_number(mode);
  env->regs[0xd] = env->banked_r13[uVar3];
  env->spsr = (uint32_t)env->banked_spsr[uVar3];
  uVar2 = env->regs[0xe];
  uVar4 = r14_bank_number(uVar4);
  env->banked_r14[uVar4] = uVar2;
  uVar4 = r14_bank_number(mode);
  env->regs[0xe] = env->banked_r14[uVar4];
  return;
}

Assistant:

static void switch_mode(CPUARMState *env, int mode)
{
    int old_mode;
    int i;

    old_mode = env->uncached_cpsr & CPSR_M;
    if (mode == old_mode)
        return;

    if (old_mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->fiq_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->usr_regs, 5 * sizeof(uint32_t));
    } else if (mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->usr_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->fiq_regs, 5 * sizeof(uint32_t));
    }

    i = bank_number(old_mode);
    env->banked_r13[i] = env->regs[13];
    env->banked_spsr[i] = env->spsr;

    i = bank_number(mode);
    env->regs[13] = env->banked_r13[i];
    env->spsr = env->banked_spsr[i];

    env->banked_r14[r14_bank_number(old_mode)] = env->regs[14];
    env->regs[14] = env->banked_r14[r14_bank_number(mode)];
}